

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall defval_ctx::add(defval_ctx *this,CTcSymLocal *l)

{
  int iVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  void *__dest;
  undefined8 in_RSI;
  long *in_RDI;
  CTcSymLocal **vnew;
  
  if (*(int *)((long)in_RDI + 0xc) == (int)in_RDI[1]) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)((int)in_RDI[1] + 0x80);
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    __dest = operator_new__(uVar3);
    memcpy(__dest,(void *)*in_RDI,(long)(int)in_RDI[1] << 3);
    if ((void *)*in_RDI != (void *)0x0) {
      operator_delete__((void *)*in_RDI);
    }
    *in_RDI = (long)__dest;
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + 0x80;
  }
  iVar1 = *(int *)((long)in_RDI + 0xc);
  *(int *)((long)in_RDI + 0xc) = iVar1 + 1;
  *(undefined8 *)(*in_RDI + (long)iVar1 * 8) = in_RSI;
  return;
}

Assistant:

void add(CTcSymLocal *l)
    {
        /* if there's not room, expand the array */
        if (nv == nvalo)
        {
            CTcSymLocal **vnew = new CTcSymLocal*[nvalo + 128];
            memcpy(vnew, v, nvalo * sizeof(*vnew));
            delete [] v;
            v = vnew;
            nvalo += 128;
        }

        /* add it */
        v[nv++] = l;
    }